

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partition_search.c
# Opt level: O0

void tx_partition_count_update
               (AV1_COMMON *cm,MACROBLOCK *x,BLOCK_SIZE plane_bsize,FRAME_COUNTS *td_counts,
               uint8_t allow_update_cdf)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  undefined8 in_RCX;
  byte in_DL;
  FRAME_COUNTS *in_RSI;
  MACROBLOCKD *in_RDI;
  MACROBLOCK *unaff_retaddr;
  int in_stack_00000010;
  uint8_t in_stack_00000018;
  int idx;
  int idy;
  int bw;
  int bh;
  TX_SIZE max_tx_size;
  int mi_height;
  int mi_width;
  MACROBLOCKD *xd;
  int in_stack_ffffffffffffffa0;
  BLOCK_SIZE in_stack_ffffffffffffffa7;
  MACROBLOCKD *in_stack_ffffffffffffffa8;
  int local_4c;
  int local_48;
  int in_stack_ffffffffffffffe8;
  FRAME_COUNTS *counts;
  
  bVar1 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"[in_DL];
  bVar2 = "\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"[in_DL];
  counts = in_RSI;
  iVar4 = get_vartx_max_txsize
                    (in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0);
  iVar3 = tx_size_high_unit[(byte)iVar4];
  iVar4 = tx_size_wide_unit[(byte)iVar4];
  *(long *)in_RSI[0x2c].switchable_interp[8] =
       *(long *)(*(long *)in_RDI[1].weight[9] + (long)(int)in_RSI[0x2b].switchable_interp[1][1] * 8)
       + (long)(int)in_RSI[2].switchable_interp[3][0];
  *(long *)(in_RSI[0x2c].switchable_interp[8] + 2) =
       (long)in_RSI[0x2c].switchable_interp[9] +
       (long)(int)(in_RSI[2].switchable_interp[2][2] & 0x1f) + 4;
  for (local_48 = 0; local_48 < (int)(uint)bVar2; local_48 = iVar3 + local_48) {
    for (local_4c = 0; local_4c < (int)(uint)bVar1; local_4c = iVar4 + local_4c) {
      update_txfm_count(unaff_retaddr,in_RDI,counts,in_DL,in_stack_ffffffffffffffe8,
                        (int)((ulong)in_RCX >> 0x20),in_stack_00000010,in_stack_00000018);
    }
  }
  return;
}

Assistant:

static void tx_partition_count_update(const AV1_COMMON *const cm, MACROBLOCK *x,
                                      BLOCK_SIZE plane_bsize,
                                      FRAME_COUNTS *td_counts,
                                      uint8_t allow_update_cdf) {
  MACROBLOCKD *xd = &x->e_mbd;
  const int mi_width = mi_size_wide[plane_bsize];
  const int mi_height = mi_size_high[plane_bsize];
  const TX_SIZE max_tx_size = get_vartx_max_txsize(xd, plane_bsize, 0);
  const int bh = tx_size_high_unit[max_tx_size];
  const int bw = tx_size_wide_unit[max_tx_size];

  xd->above_txfm_context =
      cm->above_contexts.txfm[xd->tile.tile_row] + xd->mi_col;
  xd->left_txfm_context =
      xd->left_txfm_context_buffer + (xd->mi_row & MAX_MIB_MASK);

  for (int idy = 0; idy < mi_height; idy += bh) {
    for (int idx = 0; idx < mi_width; idx += bw) {
      update_txfm_count(x, xd, td_counts, max_tx_size, 0, idy, idx,
                        allow_update_cdf);
    }
  }
}